

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pShaderControlStatementTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Performance::LoopCase::LoopCase
          (LoopCase *this,Context *context,char *name,char *description,LoopType type,
          DecisionType decisionType,bool isLoopBoundStable,bool isVertex)

{
  TestContext *testCtx;
  RenderContext *renderCtx;
  bool isVertex_local;
  bool isLoopBoundStable_local;
  DecisionType decisionType_local;
  LoopType type_local;
  char *description_local;
  char *name_local;
  Context *context_local;
  LoopCase *this_local;
  
  testCtx = Context::getTestContext(context);
  renderCtx = Context::getRenderContext(context);
  ControlStatementCase::ControlStatementCase
            (&this->super_ControlStatementCase,testCtx,renderCtx,name,description,(uint)!isVertex);
  (this->super_ControlStatementCase).super_ShaderPerformanceCase.super_TestCase.super_TestNode.
  _vptr_TestNode = (_func_int **)&PTR__LoopCase_015ae3b0;
  this->m_decisionType = decisionType;
  this->m_type = type;
  this->m_isLoopBoundStable = isLoopBoundStable;
  std::vector<float,_std::allocator<float>_>::vector(&this->m_boundArray);
  this->m_arrayBuffer = 0;
  return;
}

Assistant:

LoopCase::LoopCase (Context& context, const char* name, const char* description, LoopType type, DecisionType decisionType, bool isLoopBoundStable, bool isVertex)
	: ControlStatementCase	(context.getTestContext(), context.getRenderContext(), name, description, isVertex ? CASETYPE_VERTEX : CASETYPE_FRAGMENT)
	, m_decisionType		(decisionType)
	, m_type				(type)
	, m_isLoopBoundStable	(isLoopBoundStable)
	, m_arrayBuffer			(0)
{
}